

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O3

void av1_highbd_convolve_y_sr_intrabc_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,int bd)

{
  uint uVar1;
  int iVar2;
  uint16_t *puVar3;
  ulong uVar4;
  uint16_t uVar5;
  uint uVar6;
  
  if (0 < h) {
    puVar3 = src + src_stride;
    iVar2 = 0;
    do {
      if (0 < w) {
        uVar4 = 0;
        do {
          uVar1 = (uint)puVar3[uVar4] + (uint)src[uVar4] + 1 >> 1;
          uVar6 = uVar1 & 0xffff;
          uVar5 = (uint16_t)uVar1;
          if (bd == 10) {
            if (0x3fe < uVar6) {
              uVar5 = 0x3ff;
            }
          }
          else if (bd == 0xc) {
            if (0xffe < uVar6) {
              uVar5 = 0xfff;
            }
          }
          else if (0xfe < uVar6) {
            uVar5 = 0xff;
          }
          dst[uVar4] = uVar5;
          uVar4 = uVar4 + 1;
        } while ((uint)w != uVar4);
      }
      iVar2 = iVar2 + 1;
      puVar3 = puVar3 + src_stride;
      dst = dst + dst_stride;
      src = src + src_stride;
    } while (iVar2 != h);
  }
  return;
}

Assistant:

void av1_highbd_convolve_y_sr_intrabc_c(
    const uint16_t *src, int src_stride, uint16_t *dst, int dst_stride, int w,
    int h, const InterpFilterParams *filter_params_y, const int subpel_y_qn,
    int bd) {
  assert(subpel_y_qn == 8);
  assert(filter_params_y->taps == 2);
  (void)filter_params_y;
  (void)subpel_y_qn;

  // vertical filter
  // explicitly operate for subpel_y_qn = 8.
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      const int32_t res = src[x] + src[src_stride + x];
      dst[x] = clip_pixel_highbd(ROUND_POWER_OF_TWO(res, 1), bd);
    }
    src += src_stride;
    dst += dst_stride;
  }
}